

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

char * __thiscall
cmsys::SystemInformationImplementation::GetVendorID(SystemInformationImplementation *this)

{
  SystemInformationImplementation *this_local;
  
  switch(this->ChipManufacturer) {
  case AMD:
    this_local = (SystemInformationImplementation *)0x15171a;
    break;
  case Intel:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63de4;
    break;
  case NSC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e06;
    break;
  case UMC:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e56;
    break;
  case Cyrix:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e11;
    break;
  case NexGen:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e28;
    break;
  case IDT:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e3f;
    break;
  case Rise:
    this_local = (SystemInformationImplementation *)0x151882;
    break;
  case Transmeta:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e78;
    break;
  case Sun:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e83;
    break;
  case IBM:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63e9a;
    break;
  case Motorola:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63eb1;
    break;
  case HP:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63ec8;
    break;
  case Hygon:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63edf;
    break;
  case Zhaoxin:
    this_local = (SystemInformationImplementation *)0x151748;
    break;
  case Apple:
    this_local = (SystemInformationImplementation *)0x150d3e;
    break;
  case UnknownManufacturer:
  default:
    this_local = (SystemInformationImplementation *)anon_var_dwarf_63f18;
  }
  return (char *)this_local;
}

Assistant:

const char* SystemInformationImplementation::GetVendorID()
{
  // Return the vendor ID.
  switch (this->ChipManufacturer) {
    case Intel:
      return "Intel Corporation";
    case AMD:
      return "Advanced Micro Devices";
    case NSC:
      return "National Semiconductor";
    case Cyrix:
      return "Cyrix Corp., VIA Inc.";
    case NexGen:
      return "NexGen Inc., Advanced Micro Devices";
    case IDT:
      return "IDT\\Centaur, Via Inc., Shanghai Zhaoxin Semiconductor Co., "
             "Ltd.";
    case UMC:
      return "United Microelectronics Corp.";
    case Rise:
      return "Rise";
    case Transmeta:
      return "Transmeta";
    case Sun:
      return "Sun Microelectronics";
    case IBM:
      return "IBM";
    case Motorola:
      return "Motorola";
    case HP:
      return "Hewlett-Packard";
    case Hygon:
      return "Chengdu Haiguang IC Design Co., Ltd.";
    case Zhaoxin:
      return "Shanghai Zhaoxin Semiconductor Co., Ltd.";
    case Apple:
      return "Apple";
    case UnknownManufacturer:
    default:
      return "Unknown Manufacturer";
  }
}